

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O3

void __thiscall LexicalAnalyzer::CutLine(LexicalAnalyzer *this)

{
  ulong uVar1;
  string line;
  value_type local_48;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::push_back((char)this);
  if ((this->source)._M_string_length != 0) {
    uVar1 = 0;
    do {
      if ((this->source)._M_dataplus._M_p[uVar1] == '\n') {
        if (local_48._M_string_length != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->lines,&local_48);
          local_48._M_string_length = 0;
          *local_48._M_dataplus._M_p = '\0';
        }
      }
      else {
        std::__cxx11::string::push_back((char)&local_48);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < (this->source)._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LexicalAnalyzer::CutLine() {
    std::string line;
    source += '\n';//Add an '\n' at the end of file
    for (int i = 0; i < source.size(); i++) {
        if (source[i] != '\n') {
            line += source[i];
        } else {
            if (!line.empty()) {
                lines.push_back(line);
                line.clear();
            }
        }
    }
}